

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2612.c
# Opt level: O0

void YM2612_ClearBuffer(DEV_SMPL **buffer,UINT32 length)

{
  DEV_SMPL *pDVar1;
  DEV_SMPL *pDVar2;
  uint local_2c;
  UINT32 i;
  DEV_SMPL *bufR;
  DEV_SMPL *bufL;
  UINT32 length_local;
  DEV_SMPL **buffer_local;
  
  pDVar1 = *buffer;
  pDVar2 = buffer[1];
  for (local_2c = 0; local_2c < length; local_2c = local_2c + 1) {
    pDVar1[local_2c] = 0;
    pDVar2[local_2c] = 0;
  }
  return;
}

Assistant:

void YM2612_ClearBuffer(DEV_SMPL **buffer, UINT32 length)
{
	// the MAME core does this before updating,
	// but the Gens core does this before mixing
	DEV_SMPL *bufL, *bufR;
	UINT32 i;
	
	bufL = buffer[0];
	bufR = buffer[1];
	
	for (i = 0; i < length; i++)
	{
		bufL[i] = 0;
		bufR[i] = 0;
	}
}